

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_update.c
# Opt level: O3

lu_int __thiscall lu_update(void *this,double xtbl)

{
  double stretch;
  double dVar1;
  undefined8 uVar2;
  uint nlines;
  int pad;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  lu_int *begin;
  lu_int *end;
  lu_int *next;
  lu_int *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  lu_int *index;
  double *value;
  lu_int *marked;
  lu_int *pstack;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  lu_int lVar16;
  int iVar17;
  uint uVar18;
  lu_int lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  undefined8 *puVar29;
  int *piVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  uint *puVar37;
  int *piVar38;
  bool bVar39;
  uint uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  bool bVar48;
  ulong uVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  double dVar55;
  double dVar56;
  uint *local_170;
  int *local_168;
  lu_int ipivot;
  lu_int jpivot;
  long local_80;
  double local_78;
  undefined8 uStack_70;
  undefined8 local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  nlines = *(uint *)((long)this + 0x54);
  uVar33 = (ulong)nlines;
  lVar46 = (long)*(int *)((long)this + 0x68);
  iVar44 = *(int *)((long)this + 0x80);
  pad = *(int *)((long)this + 0x30);
  stretch = *(double *)((long)this + 0x38);
  local_80 = *(long *)((long)this + 0x260);
  lVar22 = *(long *)((long)this + 0x270);
  local_40 = *(long *)((long)this + 0x1d8);
  local_38 = *(long *)((long)this + 0x1e8);
  lVar6 = *(long *)((long)this + 0x280);
  lVar36 = *(long *)((long)this + 0x1f8);
  begin = *(lu_int **)((long)this + 0x218);
  end = *(lu_int **)((long)this + 0x228);
  next = *(lu_int **)((long)this + 0x238);
  plVar7 = *(lu_int **)((long)this + 0x248);
  lVar41 = *(long *)((long)this + 0x2a8);
  lVar23 = *(long *)((long)this + 0x2b0);
  lVar8 = *(long *)((long)this + 0x1a0);
  lVar9 = *(long *)((long)this + 0x1b8);
  lVar10 = *(long *)((long)this + 0x1a8);
  lVar11 = *(long *)((long)this + 0x1c0);
  index = *(lu_int **)((long)this + 0x1b0);
  value = *(double **)((long)this + 0x1c8);
  marked = *(lu_int **)((long)this + 0x290);
  local_168 = *(int **)((long)this + 0x210);
  pstack = *(lu_int **)((long)this + 0x2a0);
  uVar40 = *(uint *)((long)this + 0x188);
  lVar34 = (long)(int)uVar40;
  iVar20 = *(int *)(local_80 + lVar34 * 4);
  dVar1 = *(double *)(lVar41 + lVar34 * 8);
  lVar21 = (long)(int)nlines;
  iVar14 = *(int *)(lVar6 + lVar21 * 4);
  lVar25 = (long)iVar14;
  iVar17 = *(int *)(lVar10 + lVar25 * 4);
  if (iVar17 < 0) {
    bVar39 = true;
    dVar50 = 0.0;
  }
  else {
    bVar39 = true;
    dVar50 = 0.0;
    do {
      iVar45 = iVar14;
      lVar26 = lVar10 + 4 + lVar25 * 4;
      lVar32 = lVar11 + lVar25 * 8;
      lVar42 = 0;
      while (iVar17 != iVar20) {
        *(int *)(lVar10 + (long)iVar45 * 4 + lVar42 * 4) = iVar17;
        *(undefined8 *)(lVar11 + (long)iVar45 * 8 + lVar42 * 8) =
             *(undefined8 *)(lVar32 + lVar42 * 8);
        iVar17 = *(int *)(lVar26 + lVar42 * 4);
        lVar42 = lVar42 + 1;
        if (iVar17 < 0) {
          iVar14 = iVar45 + (int)lVar42;
          if (!bVar39) goto LAB_003bbe7a;
          bVar39 = true;
          goto LAB_003bbeaa;
        }
      }
      dVar50 = *(double *)(lVar32 + lVar42 * 8);
      lVar25 = lVar25 + lVar42 + 1;
      iVar17 = *(int *)(lVar26 + lVar42 * 4);
      bVar39 = false;
      iVar14 = (int)lVar42 + iVar45;
    } while (-1 < iVar17);
    iVar14 = iVar45 + (int)lVar42;
LAB_003bbe7a:
    *(int *)(lVar10 + (long)iVar14 * 4) = iVar20;
    *(double *)(lVar11 + (long)iVar14 * 8) = dVar50;
    bVar39 = false;
  }
LAB_003bbeaa:
  lVar25 = (long)iVar14 - (long)*(int *)(lVar6 + lVar21 * 4);
  iVar14 = *(int *)(lVar36 + lVar46 * 4);
  iVar17 = *(int *)(lVar36 + 4 + lVar46 * 4);
  iVar15 = *(int *)((long)this + 0x18c) + 1;
  *(int *)((long)this + 0x18c) = iVar15;
  iVar45 = *(int *)(lVar36 + lVar46 * 4);
  lVar26 = (long)iVar45;
  if (iVar45 < *(int *)(lVar36 + 4 + lVar46 * 4)) {
    do {
      lVar32 = (long)*(int *)(lVar8 + lVar26 * 4);
      marked[lVar32] = iVar15;
      *(undefined8 *)(pstack + lVar32 * 2) = *(undefined8 *)(lVar9 + lVar26 * 8);
      lVar26 = lVar26 + 1;
    } while (lVar26 < *(int *)(lVar36 + 4 + lVar46 * 4));
  }
  lVar26 = (long)*(int *)(lVar6 + lVar21 * 4);
  lVar32 = lVar25 + lVar26;
  iVar45 = (int)lVar25;
  dVar55 = dVar50;
  if (iVar45 < 1) {
    bVar48 = true;
  }
  else {
    iVar35 = 0;
    lVar25 = lVar26;
    do {
      lVar42 = (long)*(int *)(lVar10 + lVar25 * 4);
      if (marked[lVar42] == iVar15) {
        dVar55 = dVar55 - *(double *)(lVar11 + lVar25 * 8) * *(double *)(pstack + lVar42 * 2);
        iVar35 = iVar35 + 1;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < lVar32);
    bVar48 = iVar35 == 0;
  }
  if ((dVar55 == 0.0) && (!NAN(dVar55))) {
    return -6;
  }
  local_78 = ABS(dVar55);
  uStack_70 = 0;
  if (local_78 < *(double *)((long)this + 0x18)) {
    return -6;
  }
  if (iVar45 < 1) {
    iVar15 = 0;
  }
  else {
    iVar15 = 0;
    do {
      iVar35 = *(int *)(lVar22 + (long)*(int *)(lVar10 + lVar26 * 4) * 4);
      if (end[iVar35] == begin[next[iVar35]]) {
        iVar35 = end[iVar35] - begin[iVar35];
        iVar15 = (int)((double)(iVar15 + iVar35 + 1) + (double)(iVar35 + 1) * stretch + (double)pad)
        ;
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < (int)lVar32);
  }
  iVar35 = iVar15 - (end[lVar21] - begin[lVar21]);
  if (iVar35 != 0 && end[lVar21] - begin[lVar21] <= iVar15) {
    *(int *)((long)this + 0x60) = iVar35;
    return 1;
  }
  lVar25 = (long)iVar20;
  lVar26 = (long)*(int *)(lVar6 + lVar25 * 4);
  uVar18 = *(uint *)(lVar10 + lVar26 * 4);
  ipivot = iVar20;
  jpivot = uVar40;
  if (-1 < (int)uVar18) {
    puVar37 = (uint *)(lVar10 + lVar26 * 4);
    do {
      puVar37 = puVar37 + 1;
      iVar15 = *(int *)(lVar22 + (ulong)uVar18 * 4);
      iVar35 = end[iVar15];
      end[iVar15] = iVar35 + -1;
      lVar16 = find(uVar40,index,begin[iVar15],iVar35);
      index[lVar16] = index[(long)iVar35 + -1];
      value[lVar16] = value[(long)iVar35 + -1];
      uVar18 = *puVar37;
      iVar44 = iVar44 + -1;
    } while (-1 < (int)uVar18);
    lVar26 = (long)*(int *)(lVar6 + lVar25 * 4);
    if (-1 < *(int *)(lVar10 + lVar26 * 4)) {
      piVar30 = (int *)(lVar10 + lVar26 * 4);
      do {
        piVar38 = piVar30 + 1;
        *piVar30 = -1;
        piVar30 = piVar38;
      } while (-1 < *piVar38);
    }
  }
  iVar15 = *(int *)(lVar6 + lVar21 * 4);
  *(int *)(lVar6 + lVar25 * 4) = iVar15;
  *(int *)(lVar6 + lVar21 * 4) = iVar15 + iVar45 + 1;
  *(undefined4 *)(lVar10 + (long)(iVar15 + iVar45) * 4) = 0xffffffff;
  lVar26 = (long)*(int *)(lVar6 + lVar25 * 4);
  uVar18 = *(uint *)(lVar10 + lVar26 * 4);
  if (-1 < (int)uVar18) {
    lVar26 = lVar26 << 2;
    do {
      iVar15 = *(int *)(lVar22 + (ulong)uVar18 * 4);
      iVar35 = end[iVar15];
      if (iVar35 == begin[next[iVar15]]) {
        lu_file_reappend(iVar15,nlines,begin,end,next,plVar7,index,value,
                         (int)((double)((iVar35 - begin[iVar15]) + 1) * stretch + 1.0 + (double)pad)
                        );
        iVar35 = end[iVar15];
      }
      end[iVar15] = iVar35 + 1;
      index[iVar35] = uVar40;
      value[iVar35] = *(double *)(lVar11 + lVar26 * 2);
      uVar18 = *(uint *)(lVar10 + 4 + lVar26);
      lVar26 = lVar26 + 4;
    } while (-1 < (int)uVar18);
  }
  local_170 = (uint *)(local_168 + lVar21);
  iVar17 = iVar17 - iVar14;
  iVar44 = iVar44 + iVar45;
  *(double *)(lVar41 + lVar34 * 8) = dVar50;
  *(double *)(lVar23 + lVar25 * 8) = dVar50;
  if (bVar39) {
    *local_170 = uVar40;
    uVar18 = 1;
    lVar26 = 0;
    do {
      uVar24 = local_170[lVar26];
      lVar32 = (long)begin[(int)uVar24];
      iVar14 = end[(int)uVar24];
      if (begin[(int)uVar24] < iVar14) {
LAB_003bc39e:
        uVar31 = index[lVar32];
        if (uVar31 != uVar40) goto code_r0x003bc3ad;
        uVar31 = nlines;
        if (uVar24 != uVar40) {
          puVar37 = (uint *)(local_168 + lVar21 + -1);
          uVar27 = uVar33;
          do {
            *puVar37 = uVar24;
            uVar24 = ~marked[(int)uVar24];
            uVar31 = (int)uVar27 - 1;
            uVar27 = (ulong)uVar31;
            puVar37 = puVar37 + -1;
          } while (uVar40 != uVar24);
        }
        local_168[(long)(int)uVar31 + -1] = uVar40;
        uVar24 = uVar31 - 1;
        break;
      }
LAB_003bc3de:
      lVar26 = lVar26 + 1;
      uVar24 = nlines;
    } while (lVar26 < (int)uVar18);
    if (0 < (int)uVar18) {
      uVar27 = 0;
      do {
        marked[(int)local_170[uVar27]] = 0;
        uVar27 = uVar27 + 1;
      } while (uVar18 != uVar27);
    }
    iVar45 = *(int *)((long)this + 0x18c) + 1;
    *(int *)((long)this + 0x18c) = iVar45;
    iVar14 = (int)(lVar21 + -1);
    uVar27 = uVar33;
    uVar18 = nlines;
    lVar26 = (long)(int)uVar24;
    if ((int)uVar24 < iVar14) {
      do {
        lVar32 = lVar26 + 1;
        iVar15 = local_168[lVar26];
        uVar31 = local_168[lVar32];
        lVar16 = find(uVar31,index,begin[iVar15],end[iVar15]);
        index[lVar16] = iVar15;
        uVar18 = lu_dfs(iVar15,begin,end,index,(lu_int)uVar27,(lu_int *)local_170,pstack,marked,
                        iVar45);
        local_170[(int)uVar18] = uVar31;
        index[lVar16] = uVar31;
        if (lVar21 + -1 <= lVar32) break;
        uVar27 = (ulong)uVar18;
        lVar26 = lVar32;
      } while (marked[(int)uVar31] != iVar45);
      if (marked[(int)uVar31] == iVar45) goto LAB_003bc76c;
    }
    lVar16 = local_168[iVar14];
    lVar19 = lu_dfs(lVar16,begin,end,index,uVar18,(lu_int *)local_170,pstack,marked,iVar45);
    local_48 = (long)lVar19;
    local_170[local_48] = uVar40;
    iVar14 = marked[lVar16];
    marked[lVar16] = iVar14 + -1;
    lVar26 = (long)*(int *)(lVar6 + lVar25 * 4);
    uVar40 = *(uint *)(lVar10 + lVar26 * 4);
    if ((int)uVar40 < 0) {
      marked[lVar16] = iVar14;
    }
    else {
      puVar37 = (uint *)(lVar10 + lVar26 * 4);
      bVar39 = true;
      do {
        puVar37 = puVar37 + 1;
        if (marked[*(int *)(lVar22 + (ulong)uVar40 * 4)] == iVar45) {
          bVar39 = false;
        }
        uVar40 = *puVar37;
      } while (-1 < (int)uVar40);
      marked[lVar16] = iVar14;
      if (!bVar39) goto LAB_003bc76c;
    }
    uVar40 = ~uVar24 + nlines;
    piVar30 = local_168 + (int)uVar24;
    lVar22 = *(long *)((long)this + 0x260);
    lVar36 = *(long *)((long)this + 0x270);
    lVar41 = *(long *)((long)this + 0x280);
    lVar23 = *(long *)((long)this + 0x218);
    lVar8 = *(long *)((long)this + 0x228);
    lVar9 = *(long *)((long)this + 0x2a8);
    lVar25 = *(long *)((long)this + 0x2b0);
    lVar34 = *(long *)((long)this + 0x1a8);
    plVar7 = *(lu_int **)((long)this + 0x1b0);
    lVar46 = *(long *)((long)this + 0x1c0);
    iVar20 = *piVar30;
    local_58 = (long)piVar30[(int)uVar40];
    lVar32 = (long)iVar20;
    local_60 = *(undefined8 *)(lVar9 + local_58 * 8);
    lVar26 = *(long *)((long)this + 0x1c8);
    local_50 = (long)*(int *)(lVar22 + lVar32 * 4);
    iVar14 = *(int *)(lVar22 + local_58 * 4);
    uVar53 = *(undefined4 *)(lVar23 + local_58 * 4);
    lVar16 = *(lu_int *)(lVar8 + local_58 * 4);
    uVar27 = (ulong)uVar40;
    if (0 < (int)uVar40) {
      lVar12 = *(long *)((long)this + 0x238);
      lVar13 = *(long *)((long)this + 0x248);
      lVar42 = uVar27 + 1;
      do {
        iVar45 = piVar30[lVar42 + -2];
        iVar15 = piVar30[lVar42 + -1];
        lVar43 = (long)iVar45;
        lVar47 = (long)iVar15;
        *(undefined4 *)(lVar23 + lVar47 * 4) = *(undefined4 *)(lVar23 + lVar43 * 4);
        *(undefined4 *)(lVar8 + lVar47 * 4) = *(undefined4 *)(lVar8 + lVar43 * 4);
        iVar35 = *(int *)(lVar12 + lVar47 * 4);
        iVar3 = *(int *)(lVar12 + lVar43 * 4);
        iVar4 = *(int *)(lVar13 + lVar47 * 4);
        if (iVar35 == iVar45) {
          *(int *)(lVar12 + lVar43 * 4) = iVar15;
          *(int *)(lVar13 + lVar47 * 4) = iVar45;
LAB_003bcc2d:
          *(int *)(lVar12 + (long)iVar4 * 4) = iVar45;
          *(int *)(lVar13 + lVar43 * 4) = iVar4;
          *(int *)(lVar12 + lVar47 * 4) = iVar3;
          *(int *)(lVar13 + (long)iVar3 * 4) = iVar15;
        }
        else {
          iVar5 = *(int *)(lVar13 + lVar43 * 4);
          if (iVar3 != iVar15) {
            *(int *)(lVar12 + lVar43 * 4) = iVar35;
            *(int *)(lVar13 + (long)iVar35 * 4) = iVar45;
            *(int *)(lVar12 + (long)iVar5 * 4) = iVar15;
            *(int *)(lVar13 + lVar47 * 4) = iVar5;
            goto LAB_003bcc2d;
          }
          *(int *)(lVar12 + lVar47 * 4) = iVar45;
          *(int *)(lVar13 + lVar43 * 4) = iVar15;
          *(int *)(lVar12 + lVar43 * 4) = iVar35;
          *(int *)(lVar13 + (long)iVar35 * 4) = iVar45;
          *(int *)(lVar12 + (long)iVar5 * 4) = iVar15;
          *(int *)(lVar13 + lVar47 * 4) = iVar5;
        }
        iVar35 = *(int *)(lVar8 + lVar47 * 4);
        lVar19 = find(iVar15,plVar7,*(lu_int *)(lVar23 + lVar47 * 4),iVar35);
        lVar28 = (long)lVar19;
        if (lVar42 == 2) {
          uVar2 = *(undefined8 *)(lVar26 + lVar28 * 8);
          *(int *)(lVar8 + lVar47 * 4) = iVar35 + -1;
          plVar7[lVar28] = plVar7[(long)iVar35 + -1];
          puVar29 = (undefined8 *)(lVar26 + (long)*(int *)(lVar8 + lVar47 * 4) * 8);
        }
        else {
          plVar7[lVar28] = iVar45;
          uVar2 = *(undefined8 *)(lVar26 + lVar28 * 8);
          puVar29 = (undefined8 *)(lVar9 + lVar43 * 8);
        }
        *(undefined8 *)(lVar9 + lVar47 * 8) = uVar2;
        *(undefined8 *)(lVar26 + lVar28 * 8) = *puVar29;
        dVar51 = ABS(*(double *)(lVar9 + lVar47 * 8));
        dVar50 = *(double *)((long)this + 0x88);
        dVar56 = *(double *)((long)this + 0x90);
        dVar52 = dVar51;
        if (dVar50 <= dVar51) {
          dVar52 = dVar50;
        }
        *(ulong *)((long)this + 0x88) =
             ~-(ulong)NAN(dVar50) & (ulong)dVar52 | -(ulong)NAN(dVar50) & (ulong)dVar51;
        dVar52 = ABS(*(double *)(lVar9 + lVar47 * 8));
        dVar50 = dVar52;
        if (dVar52 <= dVar56) {
          dVar50 = dVar56;
        }
        *(ulong *)((long)this + 0x90) =
             ~-(ulong)NAN(dVar56) & (ulong)dVar50 | -(ulong)NAN(dVar56) & (ulong)dVar52;
        lVar42 = lVar42 + -1;
      } while (1 < lVar42);
    }
    lVar42 = (long)iVar14;
    *(undefined4 *)(lVar23 + lVar32 * 4) = uVar53;
    *(lu_int *)(lVar8 + lVar32 * 4) = lVar16;
    lVar16 = find(iVar20,plVar7,*(lu_int *)(lVar23 + lVar32 * 4),lVar16);
    lVar23 = (long)lVar16;
    plVar7[lVar23] = (lu_int)local_58;
    *(undefined8 *)(lVar9 + lVar32 * 8) = *(undefined8 *)(lVar26 + lVar23 * 8);
    *(undefined8 *)(lVar26 + lVar23 * 8) = local_60;
    dVar51 = ABS(*(double *)(lVar9 + lVar32 * 8));
    dVar50 = *(double *)((long)this + 0x88);
    dVar56 = *(double *)((long)this + 0x90);
    dVar52 = dVar51;
    if (dVar50 <= dVar51) {
      dVar52 = dVar50;
    }
    *(ulong *)((long)this + 0x88) =
         ~-(ulong)NAN(dVar50) & (ulong)dVar52 | -(ulong)NAN(dVar50) & (ulong)dVar51;
    dVar52 = ABS(*(double *)(lVar9 + lVar32 * 8));
    dVar50 = dVar52;
    if (dVar52 <= dVar56) {
      dVar50 = dVar56;
    }
    *(ulong *)((long)this + 0x90) =
         ~-(ulong)NAN(dVar56) & (ulong)dVar50 | -(ulong)NAN(dVar56) & (ulong)dVar52;
    iVar45 = *(int *)(lVar41 + local_50 * 4);
    if (0 < (int)uVar40) {
      uVar49 = 0;
      do {
        iVar15 = *(int *)(lVar22 + (long)piVar30[uVar49] * 4);
        lVar23 = uVar49 + 1;
        uVar49 = uVar49 + 1;
        iVar35 = *(int *)(lVar22 + (long)piVar30[lVar23] * 4);
        iVar3 = *(int *)(lVar41 + (long)iVar35 * 4);
        *(int *)(lVar41 + (long)iVar15 * 4) = iVar3;
        piVar38 = (int *)(lVar34 + (long)iVar3 * 4);
        lVar23 = ((long)iVar3 << 0x20) + -0x100000000;
        do {
          iVar3 = *piVar38;
          lVar23 = lVar23 + 0x100000000;
          if (iVar3 == iVar15) break;
          piVar38 = piVar38 + 1;
        } while (-1 < iVar3);
        lVar23 = lVar23 >> 0x20;
        if (iVar3 != iVar15) {
          lVar23 = -1;
        }
        *(int *)(lVar34 + lVar23 * 4) = iVar35;
        *(undefined8 *)(lVar25 + (long)iVar15 * 8) = *(undefined8 *)(lVar46 + lVar23 * 8);
        *(undefined8 *)(lVar46 + lVar23 * 8) = *(undefined8 *)(lVar25 + (long)iVar35 * 8);
      } while (uVar49 != uVar27);
    }
    local_170 = local_170 + local_48;
    *(int *)(lVar41 + lVar42 * 4) = iVar45;
    piVar38 = (int *)(lVar34 + (long)iVar45 * 4);
    lVar41 = ((long)iVar45 << 0x20) + -0x100000000;
    do {
      iVar45 = *piVar38;
      lVar41 = lVar41 + 0x100000000;
      if (iVar45 == iVar14) break;
      piVar38 = piVar38 + 1;
    } while (-1 < iVar45);
    lVar23 = -1;
    if (iVar45 == iVar14) {
      lVar23 = lVar41 >> 0x20;
    }
    *(undefined8 *)(lVar25 + lVar42 * 8) = *(undefined8 *)(lVar46 + lVar23 * 8);
    lVar41 = (lVar23 << 0x20) + -0x200000000;
    piVar38 = (int *)(lVar34 + lVar23 * 4);
    do {
      lVar41 = lVar41 + 0x100000000;
      iVar45 = *piVar38;
      piVar38 = piVar38 + 1;
    } while (-1 < iVar45);
    *(undefined4 *)(lVar34 + lVar23 * 4) = *(undefined4 *)(lVar34 + (lVar41 >> 0x1e));
    *(undefined8 *)(lVar46 + lVar23 * 8) = *(undefined8 *)(lVar46 + (lVar41 >> 0x1d));
    *(undefined4 *)(lVar34 + (lVar41 >> 0x1e)) = 0xffffffff;
    if (0 < (int)uVar40) {
      uVar27 = uVar27 + 1;
      do {
        iVar45 = piVar30[uVar27 - 1];
        iVar15 = *(int *)(lVar22 + (long)piVar30[uVar27 - 2] * 4);
        *(int *)(lVar22 + (long)iVar45 * 4) = iVar15;
        *(int *)(lVar36 + (long)iVar15 * 4) = iVar45;
        uVar27 = uVar27 - 1;
      } while (1 < uVar27);
    }
    *(int *)(lVar22 + lVar32 * 4) = iVar14;
    *(int *)(lVar36 + lVar42 * 4) = iVar20;
    iVar44 = iVar44 + -1;
    local_168 = local_168 + local_48;
    uVar40 = nlines - (int)local_48;
    if (uVar40 != 0 && (int)local_48 <= (int)nlines) {
      uVar27 = (ulong)uVar40;
      piVar30 = local_168;
      do {
        *piVar30 = *(int *)(local_80 + (long)piVar30[lVar21] * 4);
        piVar30 = piVar30 + 1;
        uVar27 = uVar27 - 1;
      } while (uVar27 != 0);
    }
  }
  else {
    if (bVar48) {
      dVar50 = *(double *)((long)this + 0x88);
      dVar56 = *(double *)((long)this + 0x90);
      uVar53 = SUB84(local_78,0);
      uVar54 = (undefined4)((ulong)local_78 >> 0x20);
      if (dVar50 <= local_78) {
        uVar53 = SUB84(dVar50,0);
        uVar54 = (undefined4)((ulong)dVar50 >> 0x20);
      }
      *(ulong *)((long)this + 0x88) =
           ~-(ulong)NAN(dVar50) & CONCAT44(uVar54,uVar53) | -(ulong)NAN(dVar50) & (ulong)local_78;
      dVar50 = local_78;
      if (local_78 <= dVar56) {
        dVar50 = dVar56;
      }
      *(ulong *)((long)this + 0x90) =
           ~-(ulong)NAN(dVar56) & (ulong)dVar50 | -(ulong)NAN(dVar56) & (ulong)local_78;
      *local_168 = iVar20;
      *local_170 = uVar40;
      if (0 < iVar17) {
        iVar20 = *(int *)(lVar36 + lVar46 * 4);
        lVar36 = 0;
        do {
          iVar14 = *(int *)(lVar8 + (long)iVar20 * 4 + lVar36 * 4);
          local_168[lVar36 + 1] = iVar14;
          local_168[lVar21 + lVar36 + 1] = *(int *)(lVar22 + (long)iVar14 * 4);
          lVar36 = lVar36 + 1;
        } while ((ulong)(iVar17 + 1) - 1 != lVar36);
      }
      uVar40 = iVar17 + 1;
      *(int *)((long)this + 0x78) = *(int *)((long)this + 0x78) + 1;
      goto LAB_003bd0f3;
    }
LAB_003bc76c:
    iVar14 = begin[lVar34];
    if (iVar14 < end[lVar34]) {
      lVar22 = (long)iVar14;
      do {
        iVar14 = *(int *)(lVar6 + (long)*(int *)(local_80 + (long)index[lVar22] * 4) * 4);
        iVar45 = *(int *)(lVar10 + (long)iVar14 * 4);
        if (iVar45 < 0) {
          lVar26 = -1;
        }
        else {
          piVar30 = (int *)(lVar10 + 4 + (long)iVar14 * 4);
          iVar15 = -1;
          do {
            if (iVar45 == iVar20) {
              iVar15 = iVar14;
            }
            iVar45 = *piVar30;
            iVar14 = iVar14 + 1;
            piVar30 = piVar30 + 1;
          } while (-1 < iVar45);
          lVar26 = (long)iVar15;
        }
        lVar32 = (long)iVar14;
        *(undefined4 *)(lVar10 + lVar26 * 4) = *(undefined4 *)(lVar10 + -4 + lVar32 * 4);
        *(undefined8 *)(lVar11 + lVar26 * 8) = *(undefined8 *)(lVar11 + -8 + lVar32 * 8);
        *(undefined4 *)(lVar10 + -4 + lVar32 * 4) = 0xffffffff;
        iVar44 = iVar44 + -1;
        lVar22 = lVar22 + 1;
      } while (lVar22 < end[lVar34]);
      iVar14 = begin[lVar34];
    }
    end[lVar34] = iVar14;
    *(double *)(lVar41 + lVar34 * 8) = dVar55;
    *(double *)(lVar23 + lVar25 * 8) = dVar55;
    dVar50 = *(double *)((long)this + 0x88);
    dVar56 = *(double *)((long)this + 0x90);
    uVar53 = SUB84(local_78,0);
    uVar54 = (undefined4)((ulong)local_78 >> 0x20);
    if (dVar50 <= local_78) {
      uVar53 = SUB84(dVar50,0);
      uVar54 = (undefined4)((ulong)dVar50 >> 0x20);
    }
    *(ulong *)((long)this + 0x88) =
         ~-(ulong)NAN(dVar50) & CONCAT44(uVar54,uVar53) | -(ulong)NAN(dVar50) & (ulong)local_78;
    dVar50 = local_78;
    if (local_78 <= dVar56) {
      dVar50 = dVar56;
    }
    *(ulong *)((long)this + 0x90) =
         ~-(ulong)NAN(dVar56) & (ulong)dVar50 | -(ulong)NAN(dVar56) & (ulong)local_78;
    iVar20 = *(int *)(lVar36 + lVar46 * 4);
    iVar14 = *(int *)(lVar36 + 4 + lVar46 * 4);
    if (iVar20 < iVar14) {
      lVar22 = (long)iVar20;
      iVar45 = 0;
      uVar53 = 0;
      uVar54 = 0;
      do {
        dVar50 = *(double *)(lVar9 + lVar22 * 8);
        if ((dVar50 != 0.0) || (NAN(dVar50))) {
          dVar56 = ABS(dVar50);
          uVar49 = -(ulong)(NAN((double)CONCAT44(uVar54,uVar53)) ||
                           NAN((double)CONCAT44(uVar54,uVar53)));
          uVar27 = uVar49 & (ulong)dVar56;
          if (dVar56 <= (double)CONCAT44(uVar54,uVar53)) {
            dVar56 = (double)CONCAT44(uVar54,uVar53);
          }
          uVar27 = ~uVar49 & (ulong)dVar56 | uVar27;
          lVar41 = (long)iVar20;
          *(undefined4 *)(lVar8 + lVar41 * 4) = *(undefined4 *)(lVar8 + lVar22 * 4);
          iVar20 = iVar20 + 1;
          *(double *)(lVar9 + lVar41 * 8) = dVar50;
          iVar45 = iVar45 + 1;
          iVar14 = *(int *)(lVar36 + 4 + lVar46 * 4);
          uVar53 = (undefined4)uVar27;
          uVar54 = (undefined4)(uVar27 >> 0x20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < iVar14);
    }
    else {
      uVar53 = 0;
      uVar54 = 0;
      iVar45 = 0;
    }
    *(int *)(lVar36 + 4 + lVar46 * 4) = iVar20;
    *(int *)((long)this + 0x84) = *(int *)((long)this + 0x84) + iVar45;
    dVar50 = *(double *)((long)this + 0x98);
    uVar27 = CONCAT44(uVar54,uVar53);
    if ((double)CONCAT44(uVar54,uVar53) <= dVar50) {
      uVar53 = SUB84(dVar50,0);
      uVar54 = (undefined4)((ulong)dVar50 >> 0x20);
    }
    *(ulong *)((long)this + 0x98) =
         ~-(ulong)NAN(dVar50) & CONCAT44(uVar54,uVar53) | -(ulong)NAN(dVar50) & uVar27;
    *(int *)((long)this + 0x68) = *(int *)((long)this + 0x68) + 1;
    *(int *)((long)this + 0x74) = *(int *)((long)this + 0x74) + 1;
    local_168 = &ipivot;
    local_170 = (uint *)&jpivot;
    uVar40 = 1;
  }
LAB_003bd0f3:
  iVar14 = *(int *)((long)this + 400);
  iVar20 = iVar14 + uVar40;
  if (iVar20 != nlines * 2 && SBORROW4(iVar20,nlines * 2) == (int)(iVar20 + nlines * -2) < 0) {
    lu_garbage_perm(this);
    iVar14 = *(int *)((long)this + 400);
  }
  if (0 < (int)uVar40) {
    uVar27 = 0;
    do {
      *(int *)(local_38 + (long)iVar14 * 4 + uVar27 * 4) = local_168[uVar27];
      uVar27 = uVar27 + 1;
    } while (uVar40 != uVar27);
    iVar14 = *(int *)((long)this + 400);
    if (0 < (int)uVar40) {
      uVar27 = 0;
      do {
        *(uint *)(local_40 + (long)iVar14 * 4 + uVar27 * 4) = local_170[uVar27];
        uVar27 = uVar27 + 1;
      } while (uVar40 != uVar27);
      iVar14 = *(int *)((long)this + 400);
    }
  }
  *(uint *)((long)this + 400) = iVar14 + uVar40;
  uVar40 = *(uint *)(lVar6 + lVar21 * 4);
  dVar50 = *(double *)((long)this + 0x40);
  if ((double)(int)uVar40 * dVar50 < (double)(int)((uVar40 - iVar44) - nlines)) {
    if (0 < (int)nlines) {
      iVar20 = -2;
      uVar27 = 0;
      do {
        lVar22 = (long)*(int *)(lVar6 + uVar27 * 4);
        iVar14 = *(int *)(lVar10 + lVar22 * 4);
        if (iVar14 == -1) {
          *(undefined4 *)(lVar6 + uVar27 * 4) = 0;
        }
        else {
          *(int *)(lVar6 + uVar27 * 4) = iVar14;
          *(int *)(lVar10 + lVar22 * 4) = iVar20;
        }
        uVar27 = uVar27 + 1;
        iVar20 = iVar20 + -1;
      } while (uVar33 != uVar27);
    }
    iVar20 = 1;
    if (1 < (int)uVar40) {
      lVar22 = 0xffffffff;
      uVar33 = 1;
      iVar14 = iVar20;
      do {
        uVar18 = *(uint *)(lVar10 + uVar33 * 4);
        if ((int)uVar18 < 0) {
          if (uVar18 != 0xffffffff) {
            lVar22 = 0xfffffffe - (ulong)uVar18;
            *(undefined4 *)(lVar10 + (long)iVar14 * 4) = *(undefined4 *)(lVar6 + lVar22 * 4);
            *(int *)(lVar6 + lVar22 * 4) = iVar14;
            uVar2 = *(undefined8 *)(lVar11 + uVar33 * 8);
            goto LAB_003bd2a5;
          }
          iVar20 = iVar14;
          if (-1 < (int)lVar22) {
            iVar20 = iVar14 + 1;
            *(undefined4 *)(lVar10 + (long)iVar14 * 4) = 0xffffffff;
          }
          lVar22 = 0xffffffff;
        }
        else {
          *(uint *)(lVar10 + (long)iVar14 * 4) = uVar18;
          uVar2 = *(undefined8 *)(lVar11 + uVar33 * 8);
LAB_003bd2a5:
          iVar20 = iVar14 + 1;
          *(undefined8 *)(lVar11 + (long)iVar14 * 8) = uVar2;
        }
        uVar33 = uVar33 + 1;
        iVar14 = iVar20;
      } while (uVar40 != uVar33);
      dVar50 = *(double *)((long)this + 0x40);
    }
    *(int *)(lVar6 + lVar21 * 4) = iVar20;
  }
  if ((double)begin[lVar21] * dVar50 <
      (double)(begin[lVar21] -
              (int)((double)(int)(pad * nlines) + stretch * (double)iVar44 + (double)iVar44))) {
    lu_file_compress(nlines,begin,end,next,index,value,stretch,pad);
  }
  *(double *)((long)this + 0x170) = ABS(dVar55 - xtbl * dVar1) / (local_78 + 1.0);
  *(int *)((long)this + 0x80) = iVar44;
  *(undefined8 *)((long)this + 0x184) = 0xffffffffffffffff;
  *(double *)((long)this + 0xa0) = (double)iVar17 + *(double *)((long)this + 0xa0);
  *(int *)((long)this + 100) = *(int *)((long)this + 100) + 1;
  *(int *)((long)this + 0x70) = *(int *)((long)this + 0x70) + 1;
  return 0;
code_r0x003bc3ad:
  if (-1 < marked[(int)uVar31]) {
    marked[(int)uVar31] = ~uVar24;
    lVar42 = (long)(int)uVar18;
    uVar18 = uVar18 + 1;
    local_170[lVar42] = uVar31;
    iVar14 = end[(int)uVar24];
  }
  lVar32 = lVar32 + 1;
  if (iVar14 <= lVar32) goto LAB_003bc3de;
  goto LAB_003bc39e;
}

Assistant:

lu_int lu_update(struct lu *this, double xtbl)
{
    const lu_int m          = this->m;
    const lu_int nforrest   = this->nforrest;
    lu_int Unz              = this->Unz;
    const lu_int pad        = this->pad;
    const double stretch    = this->stretch;
    lu_int *pmap            = this->pmap;
    lu_int *qmap            = this->qmap;
    lu_int *pivotcol        = this->pivotcol;
    lu_int *pivotrow        = this->pivotrow;
    lu_int *Ubegin          = this->Ubegin;
    lu_int *Rbegin          = this->Rbegin;
    lu_int *Wbegin          = this->Wbegin;
    lu_int *Wend            = this->Wend;
    lu_int *Wflink          = this->Wflink;
    lu_int *Wblink          = this->Wblink;
    double *col_pivot       = this->col_pivot;
    double *row_pivot       = this->row_pivot;
    lu_int *Lindex          = this->Lindex;
    double *Lvalue          = this->Lvalue;
    lu_int *Uindex          = this->Uindex;
    double *Uvalue          = this->Uvalue;
    lu_int *Windex          = this->Windex;
    double *Wvalue          = this->Wvalue;
    lu_int *marked          = this->marked;
    lu_int *iwork1          = this->iwork1;
    lu_int *iwork2          = iwork1 + m;
    double *work1           = this->work1;

    lu_int jpivot = this->btran_for_update;
    lu_int ipivot = pmap[jpivot];
    double oldpiv = col_pivot[jpivot];
    lu_int status = BASICLU_OK;

    lu_int i, j, jnext, n, nz, t, put, pos, end, where, room, grow, used,need,M;
    lu_int have_diag, intersect, istriangular, nz_roweta, nz_spike;
    lu_int nreach, *col_reach, *row_reach;
    double spike_diag, newpiv, piverr;

    assert(nforrest < m);

    /*
     * Note: If the singularity test fails or memory is insufficient, then the
     *       update is aborted and the user may call this routine a second time.
     *       Changes made to data structures in the first call must not violate
     *       the logic in the second call.
     */

    /* ------- */
    /* Prepare */
    /* ------- */

    /* if present, move diagonal element to end of spike */
    spike_diag = 0.0;
    have_diag = 0;
    put = Ubegin[m];
    for (pos = put; (i = Uindex[pos]) >= 0; pos++)
    {
        if (i != ipivot)
        {
            Uindex[put] = i;
            Uvalue[put++] = Uvalue[pos];
        }
        else
        {
            spike_diag = Uvalue[pos];
            have_diag = 1;
        }
    }
    if (have_diag)
    {
        Uindex[put] = ipivot;
        Uvalue[put] = spike_diag;
    }
    nz_spike = put - Ubegin[m]; /* nz excluding diagonal */

    nz_roweta = Rbegin[nforrest+1] - Rbegin[nforrest];

    /* ------------- */
    /* Compute pivot */
    /* ------------- */

    /*
     * newpiv is the diagonal element in the spike column after the
     * Forrest-Tomlin update has been applied. It can be computed as
     *
     *    newpiv = spike_diag - dot(spike,row eta)                (1)
     * or
     *    newpiv = xtbl * oldpiv,                                 (2)
     *
     * where spike_diag is the diagonal element in the spike column
     * before the Forrest-Tomlin update and oldpiv was the pivot element
     * in column jpivot before inserting the spike. This routine uses
     * newpiv from (1) and reports the difference to (2) to the user
     * to monitor numerical stability.
     *
     * While computing (1), count intersection of patterns of spike and
     * row eta.
     */

    /* scatter row eta into work1 and mark positions */
    M = ++this->marker;
    for (pos = Rbegin[nforrest]; pos < Rbegin[nforrest+1]; pos++)
    {
        i = Lindex[pos];
        marked[i] = M;
        work1[i] = Lvalue[pos];
    }

    /* compute newpiv and count intersection */
    newpiv = spike_diag;
    intersect = 0;
    for (pos = Ubegin[m]; pos < Ubegin[m] + nz_spike; pos++)
    {
        i = Uindex[pos];
        assert(i != ipivot);
        if (marked[i] == M)
        {
            newpiv -= Uvalue[pos] * work1[i];
            intersect++;
        }
    }

    /* singularity test */
    if (newpiv == 0 || fabs(newpiv) < this->abstol)
    {
        status = BASICLU_ERROR_singular_update;
        return status;
    }

    /* stability measure */
    piverr = fabs(newpiv - xtbl*oldpiv);

    /* ------------ */
    /* Insert spike */
    /* ------------ */

    /* calculate bound on file growth */
    grow = 0;
    for (pos = Ubegin[m]; pos < Ubegin[m] + nz_spike; pos++)
    {
        i = Uindex[pos];
        assert(i != ipivot);
        j = qmap[i];
        jnext = Wflink[j];
        if (Wend[j] == Wbegin[jnext])
        {
            nz = Wend[j] - Wbegin[j];
            grow += nz+1;                 /* row including spike entry */
            grow += stretch*(nz+1) + pad; /* extra room */
        }
    }

    /* reallocate if necessary */
    room = Wend[m] - Wbegin[m];
    if (grow > room)
    {
        this->addmemW = grow-room;
        status = BASICLU_REALLOCATE;
        return status;
    }

    /* remove column jpivot from row file */
    nz = 0;
    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
    {
        j = qmap[i];
        end = Wend[j]--;
        where = find(jpivot, Windex, Wbegin[j], end);
        assert(where < end);
        Windex[where] = Windex[end-1];
        Wvalue[where] = Wvalue[end-1];
        nz++;
    }
    Unz -= nz;

    /* erase column jpivot in column file */
    for (pos = Ubegin[ipivot]; Uindex[pos] >= 0; pos++)
    {
        Uindex[pos] = GAP;
    }

    /* set column pointers to spike, chop off diagonal */
    Ubegin[ipivot] = Ubegin[m];
    Ubegin[m] += nz_spike;
    Uindex[Ubegin[m]++] = GAP;

    /* insert spike into row file */
    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
    {
        j = qmap[i];
        jnext = Wflink[j];
        if (Wend[j] == Wbegin[jnext])
        {
            nz = Wend[j] - Wbegin[j];
            room = 1 + stretch*(nz+1) + pad;
            lu_file_reappend(j, m, Wbegin, Wend, Wflink, Wblink, Windex,
                             Wvalue, room);
        }
        end = Wend[j]++;
        Windex[end] = jpivot;
        Wvalue[end] = Uvalue[pos];
    }
    Unz += nz_spike;

    /* insert diagonal */
    col_pivot[jpivot] = spike_diag;
    row_pivot[ipivot] = spike_diag;

    /* ------------------ */
    /* Test triangularity */
    /* ------------------ */

    row_reach = NULL;
    col_reach = NULL;

    if (have_diag)
    {
        /*
         * When the spike has a nonzero diagonal element, then the spiked matrix
         * is (symmetrically) permuted triangular if and only if reach(ipivot)
         * does not intersect with the spike pattern except for ipivot. Since
         * reach(ipivot) \ {ipivot} is the structural pattern of the row eta,
         * the matrix is permuted triangular iff the patterns of the row eta
         * and the spike do not intersect.
         *
         * To update the permutations below, we have to provide reach(ipivot)
         * and the associated column indices in topological order as arrays
         * row_reach[0..nreach-1] and col_reach[0..nreach-1]. Because the
         * pattern of the row eta was computed by a dfs, we obtain row_reach
         * simply by adding ipivot to the front. col_reach can then be obtained
         * through qmap.
         */
        istriangular = intersect == 0;
        if (istriangular)
        {
            this->min_pivot = fmin(this->min_pivot, fabs(newpiv));
            this->max_pivot = fmax(this->max_pivot, fabs(newpiv));

            /* build row_reach and col_reach in topological order */
            nreach = nz_roweta + 1;
            row_reach = iwork1;
            col_reach = iwork2;
            row_reach[0] = ipivot;
            col_reach[0] = jpivot;
            pos = Rbegin[nforrest];
            for (n = 1; n < nreach; n++)
            {
                i = Lindex[pos++];
                row_reach[n] = i;
                col_reach[n] = qmap[i];
            }
            this->nsymperm_total++;
        }
    }
    else
    {
        /*
         * The spike has a zero diagonal element, so the spiked matrix may only
         * be the *un*symmetric permutation of an upper triangular matrix.
         *
         * Part 1:
         *
         * Find an augmenting path in U[pmap,:] starting from jpivot.
         * An augmenting path is a sequence of column indices such that there
         * is an edge from each node to the next, and an edge from the final
         * node back to jpivot.
         *
         * bfs_path computes such a path in path[top..m-1].
         *
         * Because jpivot has no self-edge, the path must have at least two
         * nodes. The path must exist because otherwise the spiked matrix was
         * structurally singular and the singularity test above had failed.
         */
        lu_int *path = iwork1, top;
        lu_int *reach = iwork2, rtop;
        lu_int *pstack = (void *) work1;

        top = bfs_path(m, jpivot, Wbegin, Wend, Windex, path, marked, iwork2);
        assert(top < m-1);
        assert(path[top] == jpivot);

        /*
         * Part 2a:
         *
         * For each path index j (except the final one) mark the nodes in
         * reach(j), where the reach is computed in U[pmap,:] without the path
         * edges. If a path index is contained in the reach of an index that
         * comes before it in the path, then U is not permuted triangular.
         *
         * At the same time assemble the combined reach of all path nodes
         * (except the final one) in U[pmap_new,:], where pmap_new is the
         * column-row mapping after applying the permutation associated with
         * the augmenting path. We only have to replace each index where the
         * dfs starts by the next index in the path. The combined reach is
         * then assembled in topological order in
         *
         *    reach[rtop..m-1].
         */
        istriangular = 1;
        rtop = m;
        M = ++this->marker;
        for (t = top; t < m-1 && istriangular; t++)
        {
            j = path[t];
            jnext = path[t+1];
            where = find(jnext, Windex, Wbegin[j], Wend[j]);
            assert(where < Wend[j]);
            Windex[where] = j;  /* take out for a moment */
            rtop = lu_dfs(j, Wbegin, Wend, Windex, rtop, reach, pstack, marked,
                          M);
            assert(reach[rtop] == j);
            reach[rtop] = jnext;
            Windex[where] = jnext; /* restore */
            istriangular = marked[jnext] != M;
        }

        /*
         * Part 2b:
         *
         * If the matrix looks triangular so far, then also mark the reach of
         * the final path node, which is reach(jpivot) in U[pmap_new,:].
         * U is then permuted triangular iff the combined reach does not
         * intersect the spike pattern except in the final path index.
         */
        if (istriangular)
        {
            j = path[m-1];
            rtop = lu_dfs(j, Wbegin, Wend, Windex, rtop, reach, pstack, marked,
                          M);
            assert(reach[rtop] == j);
            reach[rtop] = jpivot;
            marked[j]--;        /* unmark for a moment */
            for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
            {
                if (marked[qmap[i]] == M) istriangular = 0;
            }
            marked[j]++;        /* restore */
        }

        /*
         * If U is permuted triangular, then permute to zero-free diagonal.
         * Set up row_reach[0..nreach-1] and col_reach[0..nreach-1] for
         * updating the permutations below. The column reach is the combined
         * reach of the path nodes. The row reach is given through pmap.
         */
        if (istriangular)
        {
            lu_int nswap = m-top-1;
            permute(this, path+top, nswap);
            Unz--;
            assert(reach[rtop] == jpivot);
            col_reach = reach + rtop; /* stored in iwork2 */
            row_reach = iwork1 + rtop;
            nreach = m-rtop;
            for (n = 0; n < nreach; n++)
            {
                row_reach[n] = pmap[col_reach[n]];
            }
        }
    }

    /* --------------------- */
    /* Forrest-Tomlin update */
    /* --------------------- */

    if (!istriangular)
    {
        /* remove row ipivot from column file */
        for (pos = Wbegin[jpivot]; pos < Wend[jpivot]; pos++)
        {
            j = Windex[pos];
            assert(j != jpivot);
            where = -1;
            for (end = Ubegin[pmap[j]]; (i = Uindex[end]) >= 0; end++)
            {
                if (i == ipivot) where = end;
            }
            assert(where >= 0);
            Uindex[where] = Uindex[end-1];
            Uvalue[where] = Uvalue[end-1];
            Uindex[end-1] = -1;
            Unz--;
        }

        /* remove row ipivot from row file */
        Wend[jpivot] = Wbegin[jpivot];

        /* replace pivot */
        col_pivot[jpivot] = newpiv;
        row_pivot[ipivot] = newpiv;
        this->min_pivot = fmin(this->min_pivot, fabs(newpiv));
        this->max_pivot = fmax(this->max_pivot, fabs(newpiv));

        /* drop zeros from row eta; update max entry of row etas */
        nz = 0;
        put = Rbegin[nforrest];
        double max_eta = 0;
        for (pos = put; pos < Rbegin[nforrest+1]; pos++)
        {
            if (Lvalue[pos])
            {
                max_eta = fmax(max_eta, fabs(Lvalue[pos]));
                Lindex[put] = Lindex[pos];
                Lvalue[put++] = Lvalue[pos];
                nz++;
            }
        }
        Rbegin[nforrest+1] = put;
        this->Rnz += nz;
        this->max_eta = fmax(this->max_eta, max_eta);

        /* prepare permutation update */
        nreach = 1;
        row_reach = &ipivot;
        col_reach = &jpivot;
        this->nforrest++;
        this->nforrest_total++;
    }

    /* ------------------- */
    /* Update permutations */
    /* ------------------- */

    if (this->pivotlen + nreach > 2*m)
    {
        lu_garbage_perm(this);
    }

    /* append row indices row_reach[0..nreach-1] to end of pivot sequence */
    put = this->pivotlen;
    for (n = 0; n < nreach; n++) pivotrow[put++] = row_reach[n];

    /* append col indices col_reach[0..nreach-1] to end of pivot sequence */
    put = this->pivotlen;
    for (n = 0; n < nreach; n++) pivotcol[put++] = col_reach[n];

    this->pivotlen += nreach;

    /* -------- */
    /* Clean up */
    /* -------- */

    /* compress U if used memory is shrinked sufficiently */
    used = Ubegin[m];
    if (used-Unz-m > this->compress_thres * used)
    {
        nz = compress_packed(m, Ubegin, Uindex, Uvalue);
        assert(nz == Unz);
    }

    /* compress W if used memory is shrinked sufficiently */
    used = Wbegin[m];
    need = Unz + stretch*Unz + m*pad;
    if ((used-need) > this->compress_thres * used)
    {
        nz = lu_file_compress(m, Wbegin, Wend, Wflink, Windex, Wvalue,
                              stretch, pad);
        assert(nz == Unz);
    }

    this->pivot_error = piverr / (1.0 + fabs(newpiv));
    this->Unz = Unz;
    this->btran_for_update = -1;
    this->ftran_for_update = -1;
    this->update_cost_numer += nz_roweta;
    this->nupdate++;
    this->nupdate_total++;

    #ifdef DEBUG_EXTRA
    {
        lu_int col, row;
        check_consistency(this, &col, &row);
        assert(col < 0 && row < 0);
    }
    #endif
    return status;
}